

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGAImage.cpp
# Opt level: O0

bool __thiscall TRM::TGAImage::set(TGAImage *this,int x,int y,TGAColor *c)

{
  TGAColor *c_local;
  int y_local;
  int x_local;
  TGAImage *this_local;
  
  if ((((this->data == (uchar *)0x0) || (x < 0)) || (y < 0)) ||
     ((this->width <= x || (this->height <= y)))) {
    this_local._7_1_ = false;
  }
  else {
    memcpy(this->data + (x + y * this->width) * this->bytespp,c,(long)this->bytespp);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool TGAImage::set(int x, int y, TGAColor &c) {
  if (!data || x < 0 || y < 0 || x >= width || y >= height) {
    return false;
  }
  memcpy(data + (x + y * width) * bytespp, c.bgra, bytespp);
  return true;
}